

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_lib.cc
# Opt level: O3

int SSL_set_strict_cipher_list(SSL *ssl,char *str)

{
  bool bVar1;
  uint uVar2;
  SSL_CONFIG *pSVar3;
  
  pSVar3 = (ssl->config)._M_t.super___uniq_ptr_impl<bssl::SSL_CONFIG,_bssl::internal::Deleter>._M_t.
           super__Tuple_impl<0UL,_bssl::SSL_CONFIG_*,_bssl::internal::Deleter>.
           super__Head_base<0UL,_bssl::SSL_CONFIG_*,_false>._M_head_impl;
  if (pSVar3 == (SSL_CONFIG *)0x0) {
    uVar2 = 0;
  }
  else {
    if ((*(ushort *)&pSVar3->field_0x10d >> 0xb & 1) == 0) {
      uVar2 = EVP_has_aes_hardware();
      pSVar3 = (ssl->config)._M_t.super___uniq_ptr_impl<bssl::SSL_CONFIG,_bssl::internal::Deleter>.
               _M_t.super__Tuple_impl<0UL,_bssl::SSL_CONFIG_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_bssl::SSL_CONFIG_*,_false>._M_head_impl;
    }
    else {
      uVar2 = *(ushort *)&pSVar3->field_0x10d >> 0xc & 1;
    }
    bVar1 = bssl::ssl_create_cipher_list(&pSVar3->cipher_list,uVar2 != 0,str,true);
    uVar2 = (uint)bVar1;
  }
  return uVar2;
}

Assistant:

int SSL_set_strict_cipher_list(SSL *ssl, const char *str) {
  if (!ssl->config) {
    return 0;
  }
  const bool has_aes_hw = ssl->config->aes_hw_override
                              ? ssl->config->aes_hw_override_value
                              : EVP_has_aes_hardware();
  return ssl_create_cipher_list(&ssl->config->cipher_list, has_aes_hw, str,
                                true /* strict */);
}